

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O3

ZyanStatus
ZydisFormatterIntelPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  void *pvVar3;
  ZyanU64 ZVar4;
  ZyanStatus ZVar5;
  ulong uVar6;
  ZydisDecodedOperand *pZVar7;
  ZyanU64 ZVar8;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14a,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14b,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14c,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
    pZVar7 = context->operand;
    if (-1 < (pZVar7->field_10).mem.disp.value) goto LAB_00122fce;
    if (((pZVar7->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
       ((pZVar7->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
      if (buffer->is_token_list == '\0') {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00123281;
        ZVar2 = (buffer->string).vector.size;
        if (ZVar2 == 0) goto LAB_001232a0;
        if ((buffer->string).vector.capacity < ZVar2 + 1) {
          return 0x80100009;
        }
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x2d;
        ZVar2 = (buffer->string).vector.size;
        pvVar3 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar2 + 1;
        if (*(char *)((long)pvVar3 + ZVar2) != '\0') goto LAB_001232bf;
      }
      else {
        ZVar2 = (buffer->string).vector.size;
        if (0xfe < ZVar2 - 1) goto LAB_00123262;
        if (buffer->capacity <= ZVar2 + 4) {
          return 0x80100009;
        }
        pvVar3 = (buffer->string).vector.data;
        *(char *)((long)pvVar3 + -1) = (char)ZVar2;
        *(undefined4 *)((long)pvVar3 + ZVar2) = 0x2d0002;
        uVar6 = buffer->capacity - (ZVar2 + 2);
        buffer->capacity = uVar6;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
        (buffer->string).vector.size = 2;
        if (0xfe < uVar6) {
          uVar6 = 0xff;
        }
        (buffer->string).vector.capacity = uVar6;
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar5 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar5 < 0)) {
      return ZVar5;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar4 = (context->operand->field_10).mem.disp.value;
      ZVar8 = -ZVar4;
      if (0 < (long)ZVar4) {
        ZVar8 = ZVar4;
      }
      goto LAB_001231c9;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar4 = (context->operand->field_10).mem.disp.value;
    ZVar8 = -ZVar4;
    if (0 < (long)ZVar4) {
      ZVar8 = ZVar4;
    }
  }
  else {
    if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
      return 0x80100004;
    }
    pZVar7 = context->operand;
LAB_00122fce:
    if (((pZVar7->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
       ((pZVar7->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
      if (buffer->is_token_list == '\0') {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_00123281:
          __assert_fail("!destination->vector.allocator",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xeb,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
        ZVar2 = (buffer->string).vector.size;
        if (ZVar2 == 0) {
LAB_001232a0:
          __assert_fail("destination->vector.size && source->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xec,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
        if ((buffer->string).vector.capacity < ZVar2 + 1) {
          return 0x80100009;
        }
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x2b;
        ZVar2 = (buffer->string).vector.size;
        pvVar3 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar2 + 1;
        if (*(char *)((long)pvVar3 + ZVar2) != '\0') {
LAB_001232bf:
          __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xf7,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
      }
      else {
        ZVar2 = (buffer->string).vector.size;
        if (0xfe < ZVar2 - 1) {
LAB_00123262:
          __assert_fail("(len > 0) && (len < 256)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                        ,0xe7,
                        "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                       );
        }
        if (buffer->capacity <= ZVar2 + 4) {
          return 0x80100009;
        }
        pvVar3 = (buffer->string).vector.data;
        *(char *)((long)pvVar3 + -1) = (char)ZVar2;
        *(undefined4 *)((long)pvVar3 + ZVar2) = 0x2b0002;
        uVar6 = buffer->capacity - (ZVar2 + 2);
        buffer->capacity = uVar6;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
        (buffer->string).vector.size = 2;
        if (0xfe < uVar6) {
          uVar6 = 0xff;
        }
        (buffer->string).vector.capacity = uVar6;
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar5 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar5 < 0)) {
      return ZVar5;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar8 = (context->operand->field_10).mem.disp.value;
LAB_001231c9:
      ZVar5 = ZydisStringAppendHexU
                        (&buffer->string,ZVar8,(char)formatter->disp_padding,
                         formatter->hex_force_leading_number,formatter->hex_uppercase,
                         formatter->number_format[1][0].string,formatter->number_format[1][1].string
                        );
      goto LAB_001231f2;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar8 = (context->operand->field_10).mem.disp.value;
  }
  ZVar5 = ZydisStringAppendDecU
                    (&buffer->string,ZVar8,(char)formatter->disp_padding,
                     formatter->number_format[0][0].string,formatter->number_format[0][1].string);
LAB_001231f2:
  if (-1 < (int)ZVar5) {
    ZVar5 = 0x100000;
  }
  return ZVar5;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        if (context->operand->mem.disp.value < 0)
        {
            if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
                (context->operand->mem.index != ZYDIS_REGISTER_NONE))
            {
                ZYDIS_BUFFER_APPEND(buffer, SUB);
            }
            ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
            ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
                ZyanAbsI64(context->operand->mem.disp.value), formatter->disp_padding,
                formatter->hex_force_leading_number);
            break;
        }
        ZYAN_FALLTHROUGH;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
            (context->operand->mem.index != ZYDIS_REGISTER_NONE))
        {
            ZYDIS_BUFFER_APPEND(buffer, ADD);
        }
        ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding,
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}